

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::WaitSyncInvalidFlagTest::iterate(WaitSyncInvalidFlagTest *this)

{
  deUint32 err;
  deBool dVar1;
  EGLSyncKHR pvVar2;
  MessageBuilder *pMVar3;
  TestError *this_00;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_660;
  MessageBuilder local_650;
  MessageBuilder local_4d0;
  int local_34c;
  undefined1 local_348 [4];
  EGLint error;
  int local_1c4;
  char *pcStack_1c0;
  EGLint status;
  MessageBuilder local_1a8;
  TestLog *local_28;
  TestLog *log;
  Library *egl;
  WaitSyncInvalidFlagTest *this_local;
  
  egl = (Library *)this;
  log = (TestLog *)EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  local_28 = tcu::TestContext::getLog
                       ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  pvVar2 = (EGLSyncKHR)
           (*(code *)log->m_log[3].outputFile)
                     (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_syncType,0);
  (this->super_SyncTest).m_sync = pvVar2;
  tcu::TestLog::operator<<(&local_1a8,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_1a8,&(this->super_SyncTest).m_sync);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [21])" = eglCreateSyncKHR(");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&(this->super_SyncTest).m_eglDisplay);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
  pcStack_1c0 = getSyncTypeName((this->super_SyncTest).m_syncType);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stack0xfffffffffffffe40);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2c57cb5);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  err = (*(code *)log->m_log[6].lock)();
  eglu::checkError(err,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x496);
  local_1c4 = (*(code *)log->m_log[0xb].writer)
                        (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_sync,
                         0xffffffff);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_348,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,&local_1c4);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [19])" = eglWaitSyncKHR(");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&(this->super_SyncTest).m_eglDisplay);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&(this->super_SyncTest).m_sync);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])", 0xFFFFFFFF)");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_348);
  local_34c = (*(code *)log->m_log[6].lock)();
  tcu::TestLog::operator<<(&local_4d0,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_4d0,&local_34c);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [17])" = eglGetError()");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4d0);
  if (local_34c == 0x300c) {
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || (local_1c4 != 0)) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"status == EGL_FALSE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x4a5);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    tcu::TestContext::setTestResult
              ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestLog::operator<<(&local_650,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_650,(char (*) [19])"Unexpected error \'");
    EVar4 = eglu::getErrorStr(local_34c);
    local_660.m_getName = EVar4.m_getName;
    local_660.m_value = EVar4.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_660);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [29])"\' expected EGL_BAD_PARAMETER");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_650);
    tcu::TestContext::setTestResult
              ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

IterateResult	iterate					(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		EGLint status = egl.waitSyncKHR(m_eglDisplay, m_sync, 0xFFFFFFFF);
		log << TestLog::Message << status << " = eglWaitSyncKHR(" << m_eglDisplay << ", " << m_sync << ", 0xFFFFFFFF)" << TestLog::EndMessage;

		EGLint error = egl.getError();
		log << TestLog::Message << error << " = eglGetError()" << TestLog::EndMessage;

		if (error != EGL_BAD_PARAMETER)
		{
			log << TestLog::Message << "Unexpected error '" << eglu::getErrorStr(error) << "' expected EGL_BAD_PARAMETER" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		TCU_CHECK(status == EGL_FALSE);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}